

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.c
# Opt level: O0

int mbedtls_md_file(mbedtls_md_info_t *md_info,char *path,uchar *output)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  uchar local_458 [8];
  uchar buf [1024];
  mbedtls_md_context_t ctx;
  size_t n;
  FILE *f;
  int ret;
  uchar *output_local;
  char *path_local;
  mbedtls_md_info_t *md_info_local;
  
  if (md_info == (mbedtls_md_info_t *)0x0) {
    md_info_local._4_4_ = -0x5100;
  }
  else {
    __stream = fopen(path,"rb");
    if (__stream == (FILE *)0x0) {
      md_info_local._4_4_ = -0x5200;
    }
    else {
      mbedtls_md_init((mbedtls_md_context_t *)(buf + 0x3f8));
      f._4_4_ = mbedtls_md_setup((mbedtls_md_context_t *)(buf + 0x3f8),md_info,0);
      if (f._4_4_ == 0) {
        (*md_info->starts_func)(ctx.md_info);
        while (sVar2 = fread(local_458,1,0x400,__stream), sVar2 != 0) {
          (*md_info->update_func)(ctx.md_info,local_458,sVar2);
        }
        iVar1 = ferror(__stream);
        if (iVar1 == 0) {
          (*md_info->finish_func)(ctx.md_info,output);
        }
        else {
          f._4_4_ = -0x5200;
        }
      }
      fclose(__stream);
      mbedtls_md_free((mbedtls_md_context_t *)(buf + 0x3f8));
      md_info_local._4_4_ = f._4_4_;
    }
  }
  return md_info_local._4_4_;
}

Assistant:

int mbedtls_md_file( const mbedtls_md_info_t *md_info, const char *path, unsigned char *output )
{
    int ret;
    FILE *f;
    size_t n;
    mbedtls_md_context_t ctx;
    unsigned char buf[1024];

    if( md_info == NULL )
        return( MBEDTLS_ERR_MD_BAD_INPUT_DATA );

    if( ( f = fopen( path, "rb" ) ) == NULL )
        return( MBEDTLS_ERR_MD_FILE_IO_ERROR );

    mbedtls_md_init( &ctx );

    if( ( ret = mbedtls_md_setup( &ctx, md_info, 0 ) ) != 0 )
        goto cleanup;

    md_info->starts_func( ctx.md_ctx );

    while( ( n = fread( buf, 1, sizeof( buf ), f ) ) > 0 )
        md_info->update_func( ctx.md_ctx, buf, n );

    if( ferror( f ) != 0 )
    {
        ret = MBEDTLS_ERR_MD_FILE_IO_ERROR;
        goto cleanup;
    }

    md_info->finish_func( ctx.md_ctx, output );

cleanup:
    fclose( f );
    mbedtls_md_free( &ctx );

    return( ret );
}